

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

NodeBase * __thiscall
SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
          (EditingIterator *this)

{
  RealCount *pRVar1;
  NodeBase *pNVar2;
  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  pNVar2 = (this->super_Iterator).current;
  if (pNVar2 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x101,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar5) goto LAB_00428579;
    *puVar6 = 0;
  }
  if ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)(this->super_Iterator).current
      == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x102,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar5) goto LAB_00428579;
    *puVar6 = 0;
  }
  if (this->last == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x103,"(last != nullptr)","last != nullptr");
    if (!bVar5) {
LAB_00428579:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  this->last->next = ((this->super_Iterator).current)->next;
  pSVar3 = (this->super_Iterator).list;
  (this->super_Iterator).current = this->last;
  this->last = (NodeBase *)0x0;
  pRVar1 = &pSVar3->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return pNVar2;
}

Assistant:

NodeBase * UnlinkCurrentNode()
        {
            NodeBase * unlinkedNode = const_cast<NodeBase *>(this->current);
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));
            Assert(last != nullptr);

            const_cast<NodeBase *>(last)->Next() = this->current->Next();
            this->current = last;
            last = nullptr;
            const_cast<SListBase *>(this->list)->DecrementCount();
            return unlinkedNode;
        }